

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidRankInconsistency(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *this;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *pNVar7;
  ActivationParams *pAVar8;
  Tensor *pTVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"A",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  this = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(this,1);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"C",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pNVar6 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  pNVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar6->layers_);
  pAVar8 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_activation(pNVar7);
  CoreML::Specification::ActivationParams::_internal_mutable_relu(pAVar8);
  uVar1 = (pNVar7->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar7->name_,"relu1",puVar11);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"B");
  pTVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&pNVar7->outputtensor_);
  pTVar9->rank_ = 1;
  pNVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar6->layers_);
  pAVar8 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_activation(pNVar7);
  CoreML::Specification::ActivationParams::_internal_mutable_relu(pAVar8);
  uVar1 = (pNVar7->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar7->name_,"relu2",puVar11);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"C");
  pTVar9 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&pNVar7->inputtensor_);
  pTVar9->rank_ = 2;
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x12ce);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,"!((res).good())");
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar2;
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */

    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);

    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);


    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}